

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setInitialState
          (MultipleShootingTranscription *this,VectorDynSize *initialState)

{
  _Atomic_word *p_Var1;
  OptimalControlProblem *this_00;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar7;
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  this_00 = (this->m_ocproblem).
            super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (OptimalControlProblem *)0x0) {
    pcVar5 = "The optimal control problem pointer is empty.";
  }
  else {
    OptimalControlProblem::dynamicalSystem(this_00);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar4 = local_28->_M_use_count;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &local_28->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = local_28->_M_weak_count;
        local_28->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*local_28->_vptr__Sp_counted_base[3])();
      }
      if (iVar4 != 0) {
        wVar7 = OptimalControlProblem::dynamicalSystem
                          ((this->m_ocproblem).
                           super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        iVar4 = local_28->_M_use_count;
        do {
          LOCK();
          iVar3 = local_28->_M_use_count;
          bVar6 = iVar4 == iVar3;
          if (bVar6) {
            local_28->_M_use_count = iVar4 + 1;
            iVar3 = iVar4;
          }
          iVar4 = iVar3;
          UNLOCK();
        } while (!bVar6);
        cVar2 = (**(code **)(*local_30 + 0x40))
                          (local_30,initialState,
                           wVar7.
                           super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi._M_pi);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &local_28->_M_weak_count;
            iVar4 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar4 = local_28->_M_weak_count;
            local_28->_M_weak_count = iVar4 + -1;
          }
          if (iVar4 == 1) {
            (*local_28->_vptr__Sp_counted_base[3])();
          }
        }
        if (cVar2 != '\0') {
          return true;
        }
        pcVar5 = "Error while setting the initial state to the dynamical system.";
        goto LAB_0014f2d1;
      }
    }
    pcVar5 = "The optimal control problem does not point to any dynamical system.";
  }
LAB_0014f2d1:
  iDynTree::reportError("MultipleShootingTranscription","setInitialState",pcVar5);
  return false;
}

Assistant:

bool setInitialState(const VectorDynSize &initialState) {
                if (!(m_ocproblem)){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem pointer is empty.");
                    return false;
                }

                if (m_ocproblem->dynamicalSystem().expired()){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem does not point to any dynamical system.");
                    return false;
                }

                if (!(m_ocproblem->dynamicalSystem().lock()->setInitialState(initialState))){
                    reportError("MultipleShootingTranscription", "setInitialState", "Error while setting the initial state to the dynamical system.");
                    return false;
                }

                return true;
            }